

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcfdrivr.c
# Opt level: O3

FT_Error pcf_driver_init(FT_Module module)

{
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  pcf_driver_init( FT_Module  module )      /* PCF_Driver */
  {
#ifdef PCF_CONFIG_OPTION_LONG_FAMILY_NAMES
    PCF_Driver  driver = (PCF_Driver)module;


    driver->no_long_family_names = 0;
#else
    FT_UNUSED( module );
#endif

    return FT_Err_Ok;
  }